

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O0

void __thiscall
vkt::rasterization::anon_unknown_0::PointTestInstance::PointTestInstance
          (PointTestInstance *this,Context *context,PrimitiveWideness wideness,
          VkSampleCountFlagBits sampleCount)

{
  VkPhysicalDeviceFeatures *pVVar1;
  NotSupportedError *pNVar2;
  VkPhysicalDeviceProperties *pVVar3;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar4;
  value_type_conflict2 local_1c8;
  value_type_conflict2 local_1c4;
  MessageBuilder local_1c0;
  float *local_40;
  float *range;
  value_type_conflict2 local_24;
  VkSampleCountFlagBits local_20;
  PrimitiveWideness local_1c;
  VkSampleCountFlagBits sampleCount_local;
  PrimitiveWideness wideness_local;
  Context *context_local;
  PointTestInstance *this_local;
  
  local_20 = sampleCount;
  local_1c = wideness;
  _sampleCount_local = context;
  context_local = (Context *)this;
  BaseRenderingTestInstance::BaseRenderingTestInstance
            (&this->super_BaseRenderingTestInstance,context,sampleCount,0x100);
  (this->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__PointTestInstance_0166f1d0;
  this->m_iteration = 0;
  this->m_iterationCount = 3;
  this->m_primitiveWideness = local_1c;
  this->m_allIterationsPassed = true;
  this->m_maxPointSize = 1.0;
  std::vector<float,_std::allocator<float>_>::vector(&this->m_pointSizes);
  if (this->m_primitiveWideness == PRIMITIVEWIDENESS_NARROW) {
    local_24 = 1.0;
    std::vector<float,_std::allocator<float>_>::resize
              (&this->m_pointSizes,(long)this->m_iterationCount,&local_24);
  }
  else if (this->m_primitiveWideness == PRIMITIVEWIDENESS_WIDE) {
    pVVar1 = Context::getDeviceFeatures
                       ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
    if (pVVar1->largePoints == 0) {
      pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar2,"large point support required",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                 ,0x4cb);
      __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    pVVar3 = Context::getDeviceProperties(_sampleCount_local);
    local_40 = (pVVar3->limits).pointSizeRange;
    this_00 = Context::getTestContext
                        ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1c0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_1c0,(char (*) [32])"GL_ALIASED_POINT_SIZE_RANGE = [");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_40);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x132ea91);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_40 + 1);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x12d726b);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c0);
    if (local_40[1] <= 1.0) {
      pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar2,"wide point support required",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                 ,0x4d3);
      __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    local_1c4 = 10.0;
    std::vector<float,_std::allocator<float>_>::push_back(&this->m_pointSizes,&local_1c4);
    local_1c8 = 25.0;
    std::vector<float,_std::allocator<float>_>::push_back(&this->m_pointSizes,&local_1c8);
    std::vector<float,_std::allocator<float>_>::push_back(&this->m_pointSizes,local_40 + 1);
    this->m_maxPointSize = local_40[1];
  }
  return;
}

Assistant:

PointTestInstance::PointTestInstance (Context& context, PrimitiveWideness wideness, VkSampleCountFlagBits sampleCount)
	: BaseRenderingTestInstance	(context, sampleCount)
	, m_iteration				(0)
	, m_iterationCount			(3)
	, m_primitiveWideness		(wideness)
	, m_allIterationsPassed		(true)
	, m_maxPointSize			(1.0f)
{
	// create point sizes
	if (m_primitiveWideness == PRIMITIVEWIDENESS_NARROW)
	{
		m_pointSizes.resize(m_iterationCount, 1.0f);
	}
	else if (m_primitiveWideness == PRIMITIVEWIDENESS_WIDE)
	{
		if (!m_context.getDeviceFeatures().largePoints)
			TCU_THROW(NotSupportedError , "large point support required");

		const float*	range = context.getDeviceProperties().limits.pointSizeRange;

		m_context.getTestContext().getLog() << tcu::TestLog::Message << "GL_ALIASED_POINT_SIZE_RANGE = [" << range[0] << ", " << range[1] << "]" << tcu::TestLog::EndMessage;

		// no wide line support
		if (range[1] <= 1.0f)
			TCU_THROW(NotSupportedError , "wide point support required");

		// set hand picked sizes
		m_pointSizes.push_back(10.0f);
		m_pointSizes.push_back(25.0f);
		m_pointSizes.push_back(range[1]);
		DE_ASSERT((int)m_pointSizes.size() == m_iterationCount);

		m_maxPointSize = range[1];
	}
	else
		DE_ASSERT(false);
}